

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

void tree_pop(tree *t)

{
  void *__ptr;
  long *in_RDI;
  tree_entry *te;
  
  *(undefined1 *)(in_RDI[8] + in_RDI[0xc]) = 0;
  in_RDI[9] = in_RDI[0xc];
  if ((*in_RDI == in_RDI[1]) && (in_RDI[1] != 0)) {
    in_RDI[1] = *(long *)(in_RDI[1] + 0x10);
  }
  __ptr = (void *)*in_RDI;
  *in_RDI = *(long *)((long)__ptr + 8);
  in_RDI[0xc] = *(long *)((long)__ptr + 0x30);
  in_RDI[0xb] = in_RDI[8] + in_RDI[0xc];
  while (*(char *)in_RDI[0xb] == '/') {
    in_RDI[0xb] = in_RDI[0xb] + 1;
  }
  archive_string_free((archive_string *)0x23b893);
  free(__ptr);
  return;
}

Assistant:

static void
tree_pop(struct tree *t)
{
	struct tree_entry *te;

	t->path.s[t->dirname_length] = '\0';
	t->path.length = t->dirname_length;
	if (t->stack == t->current && t->current != NULL)
		t->current = t->current->parent;
	te = t->stack;
	t->stack = te->next;
	t->dirname_length = te->dirname_length;
	t->basename = t->path.s + t->dirname_length;
	while (t->basename[0] == '/')
		t->basename++;
	archive_string_free(&te->name);
	free(te);
}